

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void ts_parser__accept(TSParser *self,StackVersion version,Subtree lookahead)

{
  SubtreePool *pool;
  StackSlice *pSVar1;
  uint new_count;
  Subtree self_00;
  _Bool _Var2;
  ushort uVar3;
  MutableSubtree right;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  StackSliceArray SVar7;
  SubtreeArray trees;
  SubtreeArray local_48;
  ulong local_38;
  
  if (((ulong)lookahead.ptr & 1) == 0) {
    uVar3 = (lookahead.ptr)->symbol;
  }
  else {
    uVar3 = (ushort)lookahead.data.symbol;
  }
  if (uVar3 != 0) {
    __assert_fail("ts_subtree_is_eof(lookahead)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/parser.c"
                  ,0x2fd,"void ts_parser__accept(TSParser *, StackVersion, Subtree)");
  }
  ts_stack_push(self->stack,version,lookahead,false,1);
  SVar7 = ts_stack_pop_all(self->stack,version);
  if (SVar7.size == 0) {
LAB_00137b6e:
    ts_stack_remove_version(self->stack,(SVar7.contents)->version);
    if ((self->stack->heads).size <= version) {
      __assert_fail("(uint32_t)version < (&self->heads)->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                    ,0x29d,"void ts_stack_halt(Stack *, StackVersion)");
    }
    (self->stack->heads).contents[version].status = StackStatusHalted;
    return;
  }
  pool = &self->tree_pool;
  local_38 = SVar7._8_8_ & 0xffffffff;
  uVar6 = 0;
LAB_00137a4c:
  pSVar1 = SVar7.contents + uVar6;
  local_48.contents = (pSVar1->subtrees).contents;
  local_48.size = (pSVar1->subtrees).size;
  local_48.capacity = (pSVar1->subtrees).capacity;
  uVar4 = local_48._8_8_ & 0xffffffff;
  if (uVar4 != 0) {
    do {
      self_00 = (Subtree)local_48.contents[uVar4 - 1].ptr;
      if (((ulong)self_00.ptr & 1) == 0) {
        if (((self_00.ptr)->field_0x2c & 4) == 0) goto LAB_00137a9d;
      }
      else if (((ulong)self_00.ptr & 8) == 0) {
        __assert_fail("!child.data.is_inline",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/parser.c"
                      ,0x308,"void ts_parser__accept(TSParser *, StackVersion, Subtree)");
      }
      uVar4 = uVar4 - 1;
      if (uVar4 == 0) break;
    } while( true );
  }
  goto LAB_00137bb2;
LAB_00137a9d:
  new_count = (self_00.ptr)->child_count;
  if ((ulong)new_count != 0) {
    uVar5 = 0;
    do {
      ts_subtree_retain(((self_00.ptr)->field_17).field_0.children[uVar5]);
      uVar5 = uVar5 + 1;
    } while (new_count != uVar5);
  }
  array__splice((VoidArray *)&local_48,8,(int)uVar4 - 1,1,new_count,
                ((self_00.ptr)->field_17).field_0.children);
  right = ts_subtree_new_node(pool,(self_00.ptr)->symbol,&local_48,
                              (uint)((self_00.ptr)->field_17).field_0.alias_sequence_id,
                              self->language);
  ts_subtree_release(pool,self_00);
  if (right.ptr == (SubtreeHeapData *)0x0) {
LAB_00137bb2:
    __assert_fail("root.ptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/parser.c"
                  ,0x31a,"void ts_parser__accept(TSParser *, StackVersion, Subtree)");
  }
  self->accept_count = self->accept_count + 1;
  if ((self->finished_tree).ptr != (SubtreeHeapData *)0x0) {
    _Var2 = ts_parser__select_tree(self,self->finished_tree,(Subtree)right);
    if (!_Var2) {
      ts_subtree_release(pool,(Subtree)right);
      goto LAB_00137b60;
    }
    ts_subtree_release(pool,self->finished_tree);
  }
  self->finished_tree = (Subtree)right;
LAB_00137b60:
  uVar6 = uVar6 + 1;
  if (uVar6 == local_38) goto LAB_00137b6e;
  goto LAB_00137a4c;
}

Assistant:

static void ts_parser__accept(TSParser *self, StackVersion version, Subtree lookahead) {
  assert(ts_subtree_is_eof(lookahead));
  ts_stack_push(self->stack, version, lookahead, false, 1);

  StackSliceArray pop = ts_stack_pop_all(self->stack, version);
  for (uint32_t i = 0; i < pop.size; i++) {
    SubtreeArray trees = pop.contents[i].subtrees;

    Subtree root = NULL_SUBTREE;
    for (uint32_t j = trees.size - 1; j + 1 > 0; j--) {
      Subtree child = trees.contents[j];
      if (!ts_subtree_extra(child)) {
        assert(!child.data.is_inline);
        uint32_t child_count = ts_subtree_child_count(child);
        for (uint32_t k = 0; k < child_count; k++) {
          ts_subtree_retain(child.ptr->children[k]);
        }
        array_splice(&trees, j, 1, child_count, child.ptr->children);
        root = ts_subtree_from_mut(ts_subtree_new_node(
          &self->tree_pool,
          ts_subtree_symbol(child),
          &trees,
          child.ptr->alias_sequence_id,
          self->language
        ));
        ts_subtree_release(&self->tree_pool, child);
        break;
      }
    }

    assert(root.ptr);
    self->accept_count++;

    if (self->finished_tree.ptr) {
      if (ts_parser__select_tree(self, self->finished_tree, root)) {
        ts_subtree_release(&self->tree_pool, self->finished_tree);
        self->finished_tree = root;
      } else {
        ts_subtree_release(&self->tree_pool, root);
      }
    } else {
      self->finished_tree = root;
    }
  }

  ts_stack_remove_version(self->stack, pop.contents[0].version);
  ts_stack_halt(self->stack, version);
}